

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O2

void __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::put_back
          (input_stream_t<cfgfile::string_trait_t> *this,char_t ch)

{
  _Elt_pointer ppVar1;
  char_t local_19;
  undefined8 local_18;
  pos_t pStack_10;
  
  ppVar1 = (this->m_prev_positions).c.
           super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar1 != (this->m_prev_positions).c.
                super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppVar1 == (this->m_prev_positions).c.
                  super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar1 = (this->m_prev_positions).c.
               super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    local_18 = ppVar1[-1].m_column_number;
    pStack_10 = ppVar1[-1].m_line_number;
    local_19 = ch;
    std::
    deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
    ::pop_back(&(this->m_prev_positions).c);
    *(undefined4 *)&this->m_line_number = (undefined4)pStack_10;
    *(undefined4 *)((long)&this->m_line_number + 4) = local_18._4_4_;
    *(undefined4 *)&this->m_column_number = (undefined4)local_18;
    *(undefined4 *)((long)&this->m_column_number + 4) = local_18._4_4_;
    std::deque<char,_std::allocator<char>_>::push_back(&(this->m_returned_char).c,&local_19);
  }
  return;
}

Assistant:

void put_back( typename Trait::char_t ch )
	{
		if( !m_prev_positions.empty() )
		{
			const auto prev = m_prev_positions.top();
			m_prev_positions.pop();

			m_column_number = prev.m_column_number;
			m_line_number = prev.m_line_number;

			m_returned_char.push( ch );
		}
	}